

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O0

int bsdtar_getopt(bsdtar *bsdtar)

{
  char **ppcVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  uint local_4c;
  int required;
  int opt;
  size_t optlength;
  char *long_prefix;
  char *p;
  bsdtar_option *match2;
  bsdtar_option *match;
  bsdtar_option *popt;
  bsdtar *bsdtar_local;
  
  while( true ) {
    match2 = (bsdtar_option *)0x0;
    p = (char *)0x0;
    optlength = (long)"-- -- ----" + 8;
    local_4c = 0x3f;
    bsdtar->argument = (char *)0x0;
    if (bsdtar->getopt_state == 0) {
      bsdtar->argv = bsdtar->argv + 1;
      bsdtar->argc = bsdtar->argc + -1;
      if (*bsdtar->argv == (char *)0x0) {
        return -1;
      }
      if (**bsdtar->argv == '-') {
        bsdtar->getopt_state = 2;
      }
      else {
        bsdtar->getopt_state = 1;
        ppcVar1 = bsdtar->argv;
        bsdtar->argv = ppcVar1 + 1;
        bsdtar->getopt_word = *ppcVar1;
        bsdtar->argc = bsdtar->argc + -1;
      }
    }
    if (bsdtar->getopt_state == 1) {
      pcVar3 = bsdtar->getopt_word;
      bsdtar->getopt_word = pcVar3 + 1;
      local_4c = (uint)*pcVar3;
      if (local_4c == 0) {
        bsdtar->getopt_state = 2;
      }
      else {
        pcVar3 = strchr(short_options,local_4c);
        if (pcVar3 == (char *)0x0) {
          return 0x3f;
        }
        if (pcVar3[1] == ':') {
          bsdtar->argument = *bsdtar->argv;
          if (bsdtar->argument == (char *)0x0) {
            lafe_warnc(0,"Option %c requires an argument",(ulong)local_4c);
            return 0x3f;
          }
          bsdtar->argv = bsdtar->argv + 1;
          bsdtar->argc = bsdtar->argc + -1;
        }
      }
    }
    if (bsdtar->getopt_state == 2) {
      if (*bsdtar->argv == (char *)0x0) {
        return -1;
      }
      if (**bsdtar->argv != '-') {
        return -1;
      }
      iVar2 = strcmp(*bsdtar->argv,"--");
      if (iVar2 == 0) {
        bsdtar->argv = bsdtar->argv + 1;
        bsdtar->argc = bsdtar->argc + -1;
        return -1;
      }
      ppcVar1 = bsdtar->argv;
      bsdtar->argv = ppcVar1 + 1;
      bsdtar->getopt_word = *ppcVar1;
      bsdtar->argc = bsdtar->argc + -1;
      if (bsdtar->getopt_word[1] == '-') {
        bsdtar->getopt_state = 4;
        bsdtar->getopt_word = bsdtar->getopt_word + 2;
      }
      else {
        bsdtar->getopt_state = 3;
        bsdtar->getopt_word = bsdtar->getopt_word + 1;
      }
    }
    if (bsdtar->getopt_state != 3) goto LAB_0010d69c;
    pcVar3 = bsdtar->getopt_word;
    bsdtar->getopt_word = pcVar3 + 1;
    local_4c = (uint)*pcVar3;
    if (local_4c != 0) break;
    bsdtar->getopt_state = 2;
  }
  pcVar3 = strchr(short_options,local_4c);
  if (pcVar3 == (char *)0x0) {
    bsdtar_local._4_4_ = 0x3f;
  }
  else {
    if (pcVar3[1] == ':') {
      if (*bsdtar->getopt_word == '\0') {
        bsdtar->getopt_word = *bsdtar->argv;
        if (bsdtar->getopt_word == (char *)0x0) {
          lafe_warnc(0,"Option -%c requires an argument",(ulong)local_4c);
          return 0x3f;
        }
        bsdtar->argv = bsdtar->argv + 1;
        bsdtar->argc = bsdtar->argc + -1;
      }
      if (local_4c == 0x57) {
        bsdtar->getopt_state = 4;
        optlength = (size_t)anon_var_dwarf_e2e;
      }
      else {
        bsdtar->getopt_state = 2;
        bsdtar->argument = bsdtar->getopt_word;
      }
    }
LAB_0010d69c:
    if (bsdtar->getopt_state == 4) {
      bsdtar->getopt_state = 2;
      pcVar3 = strchr(bsdtar->getopt_word,0x3d);
      if (pcVar3 == (char *)0x0) {
        _required = strlen(bsdtar->getopt_word);
      }
      else {
        _required = (long)pcVar3 - (long)bsdtar->getopt_word;
        bsdtar->argument = pcVar3 + 1;
      }
      for (match = tar_longopts; match->name != (char *)0x0; match = match + 1) {
        if ((*match->name == *bsdtar->getopt_word) &&
           (iVar2 = strncmp(bsdtar->getopt_word,match->name,_required), iVar2 == 0)) {
          p = (char *)match2;
          match2 = match;
          sVar4 = strlen(match->name);
          if (sVar4 == _required) {
            p = (char *)0x0;
            break;
          }
        }
      }
      if (match2 == (bsdtar_option *)0x0) {
        lafe_warnc(0,"Option %s%s is not supported",optlength,bsdtar->getopt_word);
        bsdtar_local._4_4_ = 0x3f;
      }
      else if (p == (char *)0x0) {
        if (match2->required == 0) {
          if (bsdtar->argument != (char *)0x0) {
            lafe_warnc(0,"Option %s%s does not allow an argument",optlength,match2->name);
            return 0x3f;
          }
        }
        else if (bsdtar->argument == (char *)0x0) {
          bsdtar->argument = *bsdtar->argv;
          if (bsdtar->argument == (char *)0x0) {
            lafe_warnc(0,"Option %s%s requires an argument",optlength,match2->name);
            return 0x3f;
          }
          bsdtar->argv = bsdtar->argv + 1;
          bsdtar->argc = bsdtar->argc + -1;
        }
        bsdtar_local._4_4_ = match2->equivalent;
      }
      else {
        lafe_warnc(0,"Ambiguous option %s%s (matches --%s and --%s)",optlength,bsdtar->getopt_word,
                   match2->name,*(undefined8 *)p);
        bsdtar_local._4_4_ = 0x3f;
      }
    }
    else {
      bsdtar_local._4_4_ = local_4c;
    }
  }
  return bsdtar_local._4_4_;
}

Assistant:

int
bsdtar_getopt(struct bsdtar *bsdtar)
{
	enum { state_start = 0, state_old_tar, state_next_word,
	       state_short, state_long };

	const struct bsdtar_option *popt, *match, *match2;
	const char *p, *long_prefix;
	size_t optlength;
	int opt;
	int required;

again:
	match = NULL;
	match2 = NULL;
	long_prefix = "--";
	opt = '?';
	required = 0;
	bsdtar->argument = NULL;

	/* First time through, initialize everything. */
	if (bsdtar->getopt_state == state_start) {
		/* Skip program name. */
		++bsdtar->argv;
		--bsdtar->argc;
		if (*bsdtar->argv == NULL)
			return (-1);
		/* Decide between "new style" and "old style" arguments. */
		if (bsdtar->argv[0][0] == '-') {
			bsdtar->getopt_state = state_next_word;
		} else {
			bsdtar->getopt_state = state_old_tar;
			bsdtar->getopt_word = *bsdtar->argv++;
			--bsdtar->argc;
		}
	}

	/*
	 * We're parsing old-style tar arguments
	 */
	if (bsdtar->getopt_state == state_old_tar) {
		/* Get the next option character. */
		opt = *bsdtar->getopt_word++;
		if (opt == '\0') {
			/* New-style args can follow old-style. */
			bsdtar->getopt_state = state_next_word;
		} else {
			/* See if it takes an argument. */
			p = strchr(short_options, opt);
			if (p == NULL)
				return ('?');
			if (p[1] == ':') {
				bsdtar->argument = *bsdtar->argv;
				if (bsdtar->argument == NULL) {
					lafe_warnc(0,
					    "Option %c requires an argument",
					    opt);
					return ('?');
				}
				++bsdtar->argv;
				--bsdtar->argc;
			}
		}
	}

	/*
	 * We're ready to look at the next word in argv.
	 */
	if (bsdtar->getopt_state == state_next_word) {
		/* No more arguments, so no more options. */
		if (bsdtar->argv[0] == NULL)
			return (-1);
		/* Doesn't start with '-', so no more options. */
		if (bsdtar->argv[0][0] != '-')
			return (-1);
		/* "--" marks end of options; consume it and return. */
		if (strcmp(bsdtar->argv[0], "--") == 0) {
			++bsdtar->argv;
			--bsdtar->argc;
			return (-1);
		}
		/* Get next word for parsing. */
		bsdtar->getopt_word = *bsdtar->argv++;
		--bsdtar->argc;
		if (bsdtar->getopt_word[1] == '-') {
			/* Set up long option parser. */
			bsdtar->getopt_state = state_long;
			bsdtar->getopt_word += 2; /* Skip leading '--' */
		} else {
			/* Set up short option parser. */
			bsdtar->getopt_state = state_short;
			++bsdtar->getopt_word;  /* Skip leading '-' */
		}
	}

	/*
	 * We're parsing a group of POSIX-style single-character options.
	 */
	if (bsdtar->getopt_state == state_short) {
		/* Peel next option off of a group of short options. */
		opt = *bsdtar->getopt_word++;
		if (opt == '\0') {
			/* End of this group; recurse to get next option. */
			bsdtar->getopt_state = state_next_word;
			goto again;
		}

		/* Does this option take an argument? */
		p = strchr(short_options, opt);
		if (p == NULL)
			return ('?');
		if (p[1] == ':')
			required = 1;

		/* If it takes an argument, parse that. */
		if (required) {
			/* If arg is run-in, bsdtar->getopt_word already points to it. */
			if (bsdtar->getopt_word[0] == '\0') {
				/* Otherwise, pick up the next word. */
				bsdtar->getopt_word = *bsdtar->argv;
				if (bsdtar->getopt_word == NULL) {
					lafe_warnc(0,
					    "Option -%c requires an argument",
					    opt);
					return ('?');
				}
				++bsdtar->argv;
				--bsdtar->argc;
			}
			if (opt == 'W') {
				bsdtar->getopt_state = state_long;
				long_prefix = "-W "; /* For clearer errors. */
			} else {
				bsdtar->getopt_state = state_next_word;
				bsdtar->argument = bsdtar->getopt_word;
			}
		}
	}

	/* We're reading a long option, including -W long=arg convention. */
	if (bsdtar->getopt_state == state_long) {
		/* After this long option, we'll be starting a new word. */
		bsdtar->getopt_state = state_next_word;

		/* Option name ends at '=' if there is one. */
		p = strchr(bsdtar->getopt_word, '=');
		if (p != NULL) {
			optlength = (size_t)(p - bsdtar->getopt_word);
			bsdtar->argument = (char *)(uintptr_t)(p + 1);
		} else {
			optlength = strlen(bsdtar->getopt_word);
		}

		/* Search the table for an unambiguous match. */
		for (popt = tar_longopts; popt->name != NULL; popt++) {
			/* Short-circuit if first chars don't match. */
			if (popt->name[0] != bsdtar->getopt_word[0])
				continue;
			/* If option is a prefix of name in table, record it.*/
			if (strncmp(bsdtar->getopt_word, popt->name, optlength) == 0) {
				match2 = match; /* Record up to two matches. */
				match = popt;
				/* If it's an exact match, we're done. */
				if (strlen(popt->name) == optlength) {
					match2 = NULL; /* Forget the others. */
					break;
				}
			}
		}

		/* Fail if there wasn't a unique match. */
		if (match == NULL) {
			lafe_warnc(0,
			    "Option %s%s is not supported",
			    long_prefix, bsdtar->getopt_word);
			return ('?');
		}
		if (match2 != NULL) {
			lafe_warnc(0,
			    "Ambiguous option %s%s (matches --%s and --%s)",
			    long_prefix, bsdtar->getopt_word, match->name, match2->name);
			return ('?');
		}

		/* We've found a unique match; does it need an argument? */
		if (match->required) {
			/* Argument required: get next word if necessary. */
			if (bsdtar->argument == NULL) {
				bsdtar->argument = *bsdtar->argv;
				if (bsdtar->argument == NULL) {
					lafe_warnc(0,
					    "Option %s%s requires an argument",
					    long_prefix, match->name);
					return ('?');
				}
				++bsdtar->argv;
				--bsdtar->argc;
			}
		} else {
			/* Argument forbidden: fail if there is one. */
			if (bsdtar->argument != NULL) {
				lafe_warnc(0,
				    "Option %s%s does not allow an argument",
				    long_prefix, match->name);
				return ('?');
			}
		}
		return (match->equivalent);
	}

	return (opt);
}